

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::DuckTableScanInitGlobal
          (duckdb *this,ClientContext *context,TableFunctionInitInput *input,DataTable *storage,
          TableScanBindData *bind_data)

{
  FunctionData *bind_data_p;
  pointer puVar1;
  pointer puVar2;
  pointer pCVar3;
  DuckTableScanState *this_00;
  pointer pDVar4;
  ColumnList *this_01;
  ColumnDefinition *this_02;
  LogicalType *__x;
  ColumnIndex *col_idx;
  pointer pCVar5;
  _Head_base<0UL,_duckdb::DuckTableScanState_*,_false> local_40;
  TableScanBindData *local_38;
  
  bind_data_p = (input->bind_data).ptr;
  local_38 = bind_data;
  this_00 = (DuckTableScanState *)operator_new(0x100);
  DuckTableScanState::DuckTableScanState(this_00,context,bind_data_p);
  local_40._M_head_impl = this_00;
  pDVar4 = unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
           ::operator->((unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                         *)&local_40);
  DataTable::InitializeParallelScan(storage,context,&pDVar4->state);
  puVar1 = (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar1 != puVar2) &&
     ((long)puVar2 - (long)puVar1 !=
      (long)(input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start)) {
    pDVar4 = unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
             ::operator->((unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                           *)&local_40);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&(pDVar4->super_TableScanGlobalState).projection_ids.
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
               &(input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
    ;
    this_01 = TableCatalogEntry::GetColumns(local_38->table);
    pCVar5 = (input->column_indexes).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar3 = (input->column_indexes).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar5 != pCVar3) {
      do {
        if (pCVar5->index == 0xffffffffffffffff) {
          pDVar4 = unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                   ::operator->((unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                                 *)&local_40);
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalTypeId_const&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                     &(pDVar4->super_TableScanGlobalState).scanned_types,&LogicalType::ROW_TYPE);
        }
        else {
          pDVar4 = unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                   ::operator->((unique_ptr<duckdb::DuckTableScanState,_std::default_delete<duckdb::DuckTableScanState>,_true>
                                 *)&local_40);
          this_02 = ColumnList::GetColumn(this_01,(LogicalIndex)pCVar5->index);
          __x = ColumnDefinition::Type(this_02);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                     &(pDVar4->super_TableScanGlobalState).scanned_types,__x);
        }
        pCVar5 = pCVar5 + 1;
      } while (pCVar5 != pCVar3);
    }
  }
  *(DuckTableScanState **)this = local_40._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckTableScanInitGlobal(ClientContext &context, TableFunctionInitInput &input,
                                                             DataTable &storage, const TableScanBindData &bind_data) {
	auto g_state = make_uniq<DuckTableScanState>(context, input.bind_data.get());
	storage.InitializeParallelScan(context, g_state->state);
	if (!input.CanRemoveFilterColumns()) {
		return std::move(g_state);
	}

	g_state->projection_ids = input.projection_ids;
	auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
	const auto &columns = duck_table.GetColumns();
	for (const auto &col_idx : input.column_indexes) {
		if (col_idx.IsRowIdColumn()) {
			g_state->scanned_types.emplace_back(LogicalType::ROW_TYPE);
		} else {
			g_state->scanned_types.push_back(columns.GetColumn(col_idx.ToLogical()).Type());
		}
	}
	return std::move(g_state);
}